

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O3

void __thiscall QTreeWidget::QTreeWidget(QTreeWidget *this,QWidget *parent)

{
  void **ppvVar1;
  undefined8 uVar2;
  QTreeWidgetPrivate *this_00;
  QTreeModel *this_01;
  undefined4 *puVar3;
  QAbstractItemModel *pQVar4;
  QItemSelectionModel *pQVar5;
  QHeaderView *this_02;
  long lVar6;
  unsigned_long __i0;
  long lVar7;
  long in_FS_OFFSET;
  code *local_b8;
  ImplFn local_b0;
  code *local_a8;
  undefined8 local_a0;
  QObject local_98 [8];
  QObject local_90 [8];
  QObject local_88 [8];
  QObject local_80 [8];
  QObject local_78 [8];
  QObject local_70 [8];
  QObject local_68 [8];
  QObject local_60 [8];
  QObject local_58 [8];
  QObject local_50 [8];
  QObject local_48 [8];
  QObject local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QTreeWidgetPrivate *)operator_new(0x6f0);
  QTreeWidgetPrivate::QTreeWidgetPrivate(this_00);
  QTreeView::QTreeView(&this->super_QTreeView,(QTreeViewPrivate *)this_00,parent);
  *(undefined ***)
   &(this->super_QTreeView).super_QAbstractItemView.super_QAbstractScrollArea.super_QFrame.
    super_QWidget = &PTR_metaObject_008108a0;
  *(undefined ***)
   &(this->super_QTreeView).super_QAbstractItemView.super_QAbstractScrollArea.super_QFrame.
    super_QWidget.super_QPaintDevice = &PTR__QTreeWidget_00810be0;
  lVar6 = *(long *)&(this->super_QTreeView).super_QAbstractItemView.super_QAbstractScrollArea.
                    super_QFrame.super_QWidget.field_0x8;
  this_01 = (QTreeModel *)operator_new(0x58);
  QTreeModel::QTreeModel(this_01,1,this);
  QTreeView::setModel(&this->super_QTreeView,(QAbstractItemModel *)this_01);
  local_a8 = QAbstractItemView::pressed;
  lVar7 = 0;
  local_a0 = 0;
  local_b8 = QTreeWidgetPrivate::emitItemPressed;
  local_b0 = (ImplFn)0x0;
  ppvVar1 = *(void ***)(lVar6 + 8);
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QTreeWidgetPrivate::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar3 + 4) = QTreeWidgetPrivate::emitItemPressed;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_98,(void **)this,(QObject *)&local_a8,ppvVar1,(QSlotObjectBase *)&local_b8,
             (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  local_a8 = QAbstractItemView::clicked;
  local_a0 = 0;
  local_b8 = QTreeWidgetPrivate::emitItemClicked;
  local_b0 = (ImplFn)0x0;
  ppvVar1 = *(void ***)(lVar6 + 8);
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QTreeWidgetPrivate::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar3 + 4) = QTreeWidgetPrivate::emitItemClicked;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_90,(void **)this,(QObject *)&local_a8,ppvVar1,(QSlotObjectBase *)&local_b8,
             (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  local_a8 = QAbstractItemView::doubleClicked;
  local_a0 = 0;
  local_b8 = QTreeWidgetPrivate::emitItemDoubleClicked;
  local_b0 = (ImplFn)0x0;
  ppvVar1 = *(void ***)(lVar6 + 8);
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QTreeWidgetPrivate::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar3 + 4) = QTreeWidgetPrivate::emitItemDoubleClicked;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_88,(void **)this,(QObject *)&local_a8,ppvVar1,(QSlotObjectBase *)&local_b8,
             (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  local_a8 = QAbstractItemView::activated;
  local_a0 = 0;
  local_b8 = QTreeWidgetPrivate::emitItemActivated;
  local_b0 = (ImplFn)0x0;
  ppvVar1 = *(void ***)(lVar6 + 8);
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QTreeWidgetPrivate::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar3 + 4) = QTreeWidgetPrivate::emitItemActivated;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_80,(void **)this,(QObject *)&local_a8,ppvVar1,(QSlotObjectBase *)&local_b8,
             (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  local_a8 = QAbstractItemView::entered;
  local_a0 = 0;
  local_b8 = QTreeWidgetPrivate::emitItemEntered;
  local_b0 = (ImplFn)0x0;
  ppvVar1 = *(void ***)(lVar6 + 8);
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QTreeWidgetPrivate::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar3 + 4) = QTreeWidgetPrivate::emitItemEntered;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_78,(void **)this,(QObject *)&local_a8,ppvVar1,(QSlotObjectBase *)&local_b8,
             (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  local_a8 = QTreeView::expanded;
  local_a0 = 0;
  local_b8 = QTreeWidgetPrivate::emitItemExpanded;
  local_b0 = (ImplFn)0x0;
  ppvVar1 = *(void ***)(lVar6 + 8);
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QTreeWidgetPrivate::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar3 + 4) = QTreeWidgetPrivate::emitItemExpanded;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_70,(void **)this,(QObject *)&local_a8,ppvVar1,(QSlotObjectBase *)&local_b8,
             (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  local_a8 = QTreeView::collapsed;
  local_a0 = 0;
  local_b8 = QTreeWidgetPrivate::emitItemCollapsed;
  local_b0 = (ImplFn)0x0;
  ppvVar1 = *(void ***)(lVar6 + 8);
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QTreeWidgetPrivate::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar3 + 4) = QTreeWidgetPrivate::emitItemCollapsed;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_68,(void **)this,(QObject *)&local_a8,ppvVar1,(QSlotObjectBase *)&local_b8,
             (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  pQVar4 = QAbstractItemView::model((QAbstractItemView *)this);
  local_a8 = QAbstractItemModel::dataChanged;
  local_a0 = 0;
  local_b8 = QTreeWidgetPrivate::emitItemChanged;
  local_b0 = (ImplFn)0x0;
  ppvVar1 = *(void ***)(lVar6 + 8);
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QTreeWidgetPrivate::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar3 + 4) = QTreeWidgetPrivate::emitItemChanged;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_60,(void **)pQVar4,(QObject *)&local_a8,ppvVar1,(QSlotObjectBase *)&local_b8,
             (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  pQVar4 = QAbstractItemView::model((QAbstractItemView *)this);
  local_a8 = QAbstractItemModel::dataChanged;
  local_a0 = 0;
  local_b8 = QTreeWidgetPrivate::dataChanged;
  local_b0 = (ImplFn)0x0;
  ppvVar1 = *(void ***)(lVar6 + 8);
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QTreeWidgetPrivate::*)(const_QModelIndex_&,_const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&,_const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar3 + 4) = QTreeWidgetPrivate::dataChanged;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_58,(void **)pQVar4,(QObject *)&local_a8,ppvVar1,(QSlotObjectBase *)&local_b8,
             (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  pQVar4 = QAbstractItemView::model((QAbstractItemView *)this);
  local_a8 = QAbstractItemModel::columnsRemoved;
  local_a0 = 0;
  local_b8 = QTreeWidgetPrivate::sort;
  local_b0 = (ImplFn)0x0;
  ppvVar1 = *(void ***)(lVar6 + 8);
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::QPrivateSlotObject<void_(QTreeWidgetPrivate::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar3 + 4) = QTreeWidgetPrivate::sort;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_50,(void **)pQVar4,(QObject *)&local_a8,ppvVar1,(QSlotObjectBase *)&local_b8,
             (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  pQVar5 = QAbstractItemView::selectionModel((QAbstractItemView *)this);
  local_a8 = QItemSelectionModel::currentChanged;
  local_a0 = 0;
  local_b8 = QTreeWidgetPrivate::emitCurrentItemChanged;
  local_b0 = (ImplFn)0x0;
  ppvVar1 = *(void ***)(lVar6 + 8);
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QTreeWidgetPrivate::*)(const_QModelIndex_&,_const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&,_const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar3 + 4) = QTreeWidgetPrivate::emitCurrentItemChanged;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_48,(void **)pQVar5,(QObject *)&local_a8,ppvVar1,(QSlotObjectBase *)&local_b8,
             (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  pQVar5 = QAbstractItemView::selectionModel((QAbstractItemView *)this);
  local_a8 = QItemSelectionModel::selectionChanged;
  local_a0 = 0;
  local_b8 = QTreeWidgetPrivate::selectionChanged;
  local_b0 = (ImplFn)0x0;
  ppvVar1 = *(void ***)(lVar6 + 8);
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QTreeWidgetPrivate::*)(const_QItemSelection_&,_const_QItemSelection_&),_QtPrivate::List<const_QItemSelection_&,_const_QItemSelection_&>,_void>
       ::impl;
  *(code **)(puVar3 + 4) = QTreeWidgetPrivate::selectionChanged;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_40,(void **)pQVar5,(QObject *)&local_a8,ppvVar1,(QSlotObjectBase *)&local_b8,
             (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  do {
    uVar2 = *(undefined8 *)(lVar6 + 0x688 + lVar7 * 8);
    *(undefined8 *)(lVar6 + 0x688 + lVar7 * 8) = *(undefined8 *)(local_90 + lVar7 * 8 + -8);
    *(undefined8 *)(local_90 + lVar7 * 8 + -8) = uVar2;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0xc);
  lVar6 = 0x58;
  do {
    QMetaObject::Connection::~Connection((Connection *)(local_90 + lVar6 + -8));
    lVar6 = lVar6 + -8;
  } while (lVar6 != -8);
  this_02 = QTreeView::header(&this->super_QTreeView);
  QHeaderView::setSectionsClickable(this_02,false);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTreeWidget::QTreeWidget(QWidget *parent)
    : QTreeView(*new QTreeWidgetPrivate(), parent)
{
    Q_D(QTreeWidget);
    QTreeView::setModel(new QTreeModel(1, this));
    d->connections = {
        QObjectPrivate::connect(this, &QTreeWidget::pressed,
                                d, &QTreeWidgetPrivate::emitItemPressed),
        QObjectPrivate::connect(this, &QTreeWidget::clicked,
                                d, &QTreeWidgetPrivate::emitItemClicked),
        QObjectPrivate::connect(this, &QTreeWidget::doubleClicked,
                                d, &QTreeWidgetPrivate::emitItemDoubleClicked),
        QObjectPrivate::connect(this, &QTreeWidget::activated,
                                d, &QTreeWidgetPrivate::emitItemActivated),
        QObjectPrivate::connect(this, &QTreeWidget::entered,
                                d, &QTreeWidgetPrivate::emitItemEntered),
        QObjectPrivate::connect(this, &QTreeWidget::expanded,
                                d, &QTreeWidgetPrivate::emitItemExpanded),
        QObjectPrivate::connect(this, &QTreeWidget::collapsed,
                                d, &QTreeWidgetPrivate::emitItemCollapsed),
        QObjectPrivate::connect(model(), &QAbstractItemModel::dataChanged,
                                d, &QTreeWidgetPrivate::emitItemChanged),
        QObjectPrivate::connect(model(), &QAbstractItemModel::dataChanged,
                                d, &QTreeWidgetPrivate::dataChanged),
        QObjectPrivate::connect(model(), &QAbstractItemModel::columnsRemoved,
                                d, &QTreeWidgetPrivate::sort),
        QObjectPrivate::connect(selectionModel(), &QItemSelectionModel::currentChanged,
                                d, &QTreeWidgetPrivate::emitCurrentItemChanged),
        QObjectPrivate::connect(selectionModel(), &QItemSelectionModel::selectionChanged,
                                d, &QTreeWidgetPrivate::selectionChanged)
    };
    header()->setSectionsClickable(false);
}